

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendReceiver.cpp
# Opt level: O2

string * __thiscall
SendReceiver::sendInfoRequest(string *__return_storage_ptr__,SendReceiver *this,string *id)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string link;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,"https://anonfile.com/api/v2/file/",id);
  std::operator+(&link,&local_50,"/info");
  std::__cxx11::string::~string((string *)&local_50);
  lVar2 = curl_easy_init();
  if (lVar2 != 0) {
    curl_easy_setopt(lVar2,0x2712,link._M_dataplus._M_p);
    curl_easy_setopt(lVar2,0x34,1);
    curl_easy_setopt(lVar2,0x4e2b,writeCallback);
    curl_easy_setopt(lVar2,0x2711,__return_storage_ptr__);
    iVar1 = curl_easy_perform(lVar2);
    if (iVar1 != 0) {
      std::operator<<((ostream *)&std::cout,"Error, check your internet connection!\n");
    }
  }
  curl_easy_cleanup(lVar2);
  std::__cxx11::string::~string((string *)&link);
  return __return_storage_ptr__;
}

Assistant:

std::string SendReceiver::sendInfoRequest(const std::string& id) {
  std::string data;
  std::string link = Anonfiles::Fileinfo + id + "/info";
  CURL* curl = curl_easy_init();
  CURLcode res;

  if (curl) {
    curl_easy_setopt(curl, CURLOPT_URL, link.c_str());

#ifndef LINUX
    curl_easy_setopt(curl, CURLOPT_SSLCERTTYPE, "PEM");
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1L);
    curl_easy_setopt(curl, CURLOPT_CAINFO, NULL);
    curl_easy_setopt(curl, CURLOPT_CAPATH, NULL);
    curl_easy_setopt(curl, CURLOPT_FRESH_CONNECT, 1L);
    curl_easy_setopt(curl, CURLOPT_SSL_CTX_FUNCTION, *sslctx_function); // set void* and load cacert.pem from memory
#endif

    curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &data);

    res = curl_easy_perform(curl);
    if (res != CURLE_OK)
      std::cout << "Error, check your internet connection!\n";
  }

  curl_easy_cleanup(curl);

  return data;
}